

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covCore.c
# Opt level: O0

int Abc_NodeCovPropagate(Cov_Man_t *p,Abc_Obj_t *pObj)

{
  int iVar1;
  int Pol;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pObj_01;
  Vec_Int_t *vVec;
  Vec_Int_t *pVVar2;
  Min_Cube_t *local_c8;
  Min_Cube_t *local_c0;
  Min_Cube_t *local_b8;
  Min_Cube_t *local_b0;
  Vec_Int_t *local_a8;
  Min_Cube_t *local_a0;
  Vec_Int_t *local_98;
  Vec_Int_t *local_90;
  int fCompl1;
  int fCompl0;
  Abc_Obj_t *pObj1;
  Abc_Obj_t *pObj0;
  Vec_Int_t *vSupp1;
  Vec_Int_t *vSupp0;
  Vec_Int_t *vSupp;
  Min_Cube_t *pCover1;
  Min_Cube_t *pCover0;
  Min_Cube_t *pCov1;
  Min_Cube_t *pCov0;
  Min_Cube_t *pCoverX;
  Min_Cube_t *pCoverN;
  Min_Cube_t *pCoverP;
  Abc_Obj_t *pObj_local;
  Cov_Man_t *p_local;
  
  pCoverN = (Min_Cube_t *)0x0;
  pCoverX = (Min_Cube_t *)0x0;
  pCov0 = (Min_Cube_t *)0x0;
  pObj_00 = Abc_ObjFanin0(pObj);
  pObj_01 = Abc_ObjFanin1(pObj);
  if ((*(uint *)&pObj_00->field_0x14 >> 4 & 1) != 0) {
    Vec_IntWriteEntry(p->vTriv0,0,pObj_00->Id);
  }
  if ((*(uint *)&pObj_01->field_0x14 >> 4 & 1) != 0) {
    Vec_IntWriteEntry(p->vTriv1,0,pObj_01->Id);
  }
  if ((*(uint *)&pObj_00->field_0x14 >> 4 & 1) == 0) {
    local_90 = Abc_ObjGetSupp(pObj_00);
  }
  else {
    local_90 = p->vTriv0;
  }
  if ((*(uint *)&pObj_01->field_0x14 >> 4 & 1) == 0) {
    local_98 = Abc_ObjGetSupp(pObj_01);
  }
  else {
    local_98 = p->vTriv1;
  }
  vVec = Abc_NodeCovSupport(p,local_90,local_98);
  if (p->nFaninMax < vVec->nSize) {
    Vec_IntFree(vVec);
    p_local._4_4_ = 0;
  }
  else {
    iVar1 = Abc_ObjFaninC0(pObj);
    Pol = Abc_ObjFaninC1(pObj);
    if (p->fUseEsop != 0) {
      if ((*(uint *)&pObj_00->field_0x14 >> 4 & 1) == 0) {
        local_a0 = Abc_ObjGetCover2(pObj_00);
      }
      else {
        local_a0 = p->pManMin->pTriv0[0];
      }
      if ((*(uint *)&pObj_01->field_0x14 >> 4 & 1) == 0) {
        local_a8 = (Vec_Int_t *)Abc_ObjGetCover2(pObj_01);
      }
      else {
        local_a8 = (Vec_Int_t *)p->pManMin->pTriv1[0];
      }
      if ((local_a0 != (Min_Cube_t *)0x0) && (local_a8 != (Vec_Int_t *)0x0)) {
        if (iVar1 == 0) {
          pCover1 = local_a0;
        }
        else if ((local_a0 == (Min_Cube_t *)0x0) || (*(uint *)&local_a0->field_0x8 >> 0x16 != 0)) {
          pCover1 = p->pManMin->pOne0;
          p->pManMin->pOne0->pNext = local_a0;
        }
        else {
          pCover1 = local_a0->pNext;
        }
        if (Pol == 0) {
          vSupp = local_a8;
        }
        else if ((local_a8 == (Vec_Int_t *)0x0) || (*(uint *)&local_a8->pArray >> 0x16 != 0)) {
          vSupp = (Vec_Int_t *)p->pManMin->pOne1;
          p->pManMin->pOne1->pNext = (Min_Cube_t *)local_a8;
        }
        else {
          vSupp = *(Vec_Int_t **)local_a8;
        }
        pCov0 = Abc_NodeCovProduct(p,pCover1,(Min_Cube_t *)vSupp,1,vVec->nSize);
      }
    }
    if (p->fUseSop != 0) {
      if ((*(uint *)&pObj_00->field_0x14 >> 4 & 1) == 0) {
        local_b0 = Abc_ObjGetCover(pObj_00,iVar1);
      }
      else {
        local_b0 = p->pManMin->pTriv0[iVar1];
      }
      if ((*(uint *)&pObj_01->field_0x14 >> 4 & 1) == 0) {
        local_b8 = Abc_ObjGetCover(pObj_01,Pol);
      }
      else {
        local_b8 = p->pManMin->pTriv1[Pol];
      }
      if ((local_b0 != (Min_Cube_t *)0x0) && (local_b8 != (Min_Cube_t *)0x0)) {
        pCoverN = Abc_NodeCovProduct(p,local_b0,local_b8,0,vVec->nSize);
      }
      if ((*(uint *)&pObj_00->field_0x14 >> 4 & 1) == 0) {
        local_c0 = Abc_ObjGetCover(pObj_00,(uint)((iVar1 != 0 ^ 0xffU) & 1));
      }
      else {
        local_c0 = p->pManMin->pTriv0[(int)(uint)((iVar1 != 0 ^ 0xffU) & 1)];
      }
      if ((*(uint *)&pObj_01->field_0x14 >> 4 & 1) == 0) {
        local_c8 = Abc_ObjGetCover(pObj_01,(uint)((Pol != 0 ^ 0xffU) & 1));
      }
      else {
        local_c8 = p->pManMin->pTriv1[(int)(uint)((Pol != 0 ^ 0xffU) & 1)];
      }
      if ((local_c0 != (Min_Cube_t *)0x0) && (local_c8 != (Min_Cube_t *)0x0)) {
        pCoverX = Abc_NodeCovSum(p,local_c0,local_c8,0,vVec->nSize);
      }
    }
    if (((pCov0 == (Min_Cube_t *)0x0) && (pCoverN == (Min_Cube_t *)0x0)) &&
       (pCoverX == (Min_Cube_t *)0x0)) {
      Vec_IntFree(vVec);
      p_local._4_4_ = 0;
    }
    else {
      pVVar2 = Abc_ObjGetSupp(pObj);
      if (pVVar2 != (Vec_Int_t *)0x0) {
        __assert_fail("Abc_ObjGetSupp(pObj) == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/cov/covCore.c"
                      ,0x1bb,"int Abc_NodeCovPropagate(Cov_Man_t *, Abc_Obj_t *)");
      }
      Abc_ObjSetSupp(pObj,vVec);
      Abc_ObjSetCover(pObj,pCoverN,0);
      Abc_ObjSetCover(pObj,pCoverX,1);
      Abc_ObjSetCover2(pObj,pCov0);
      p->nSupps = p->nSupps + 1;
      iVar1 = Abc_MaxInt(p->nSuppsMax,p->nSupps);
      p->nSuppsMax = iVar1;
      p_local._4_4_ = 1;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Abc_NodeCovPropagate( Cov_Man_t * p, Abc_Obj_t * pObj )
{
    Min_Cube_t * pCoverP = NULL, * pCoverN = NULL, * pCoverX = NULL;
    Min_Cube_t * pCov0, * pCov1, * pCover0, * pCover1;
    Vec_Int_t * vSupp, * vSupp0, * vSupp1;
    Abc_Obj_t * pObj0, * pObj1;
    int fCompl0, fCompl1;

    pObj0 = Abc_ObjFanin0( pObj );
    pObj1 = Abc_ObjFanin1( pObj );

    if ( pObj0->fMarkA )  Vec_IntWriteEntry( p->vTriv0, 0, pObj0->Id );
    if ( pObj1->fMarkA )  Vec_IntWriteEntry( p->vTriv1, 0, pObj1->Id );
 
    // get the resulting support
    vSupp0 = pObj0->fMarkA? p->vTriv0 : Abc_ObjGetSupp(pObj0);
    vSupp1 = pObj1->fMarkA? p->vTriv1 : Abc_ObjGetSupp(pObj1);
    vSupp  = Abc_NodeCovSupport( p, vSupp0, vSupp1 );

    // quit if support if too large
    if ( vSupp->nSize > p->nFaninMax )
    {
        Vec_IntFree( vSupp );
        return 0;
    }

    // get the complemented attributes
    fCompl0 = Abc_ObjFaninC0( pObj );
    fCompl1 = Abc_ObjFaninC1( pObj );

    // propagate ESOP
    if ( p->fUseEsop )
    {
        // get the covers
        pCov0 = pObj0->fMarkA? p->pManMin->pTriv0[0] : Abc_ObjGetCover2(pObj0);
        pCov1 = pObj1->fMarkA? p->pManMin->pTriv1[0] : Abc_ObjGetCover2(pObj1);
        if ( pCov0 && pCov1 )
        {
            // complement the first if needed
            if ( !fCompl0 )
                pCover0 = pCov0;
            else if ( pCov0 && pCov0->nLits == 0 ) // topmost one is the tautology cube
                pCover0 = pCov0->pNext;
            else
                pCover0 = p->pManMin->pOne0, p->pManMin->pOne0->pNext = pCov0;

            // complement the second if needed
            if ( !fCompl1 )
                pCover1 = pCov1;
            else if ( pCov1 && pCov1->nLits == 0 ) // topmost one is the tautology cube
                pCover1 = pCov1->pNext;
            else
                pCover1 = p->pManMin->pOne1, p->pManMin->pOne1->pNext = pCov1;

            // derive the new cover
            pCoverX = Abc_NodeCovProduct( p, pCover0, pCover1, 1, vSupp->nSize );
        }
    }
    // propagate SOPs
    if ( p->fUseSop )
    {
        // get the covers for the direct polarity
        pCover0 = pObj0->fMarkA? p->pManMin->pTriv0[fCompl0] : Abc_ObjGetCover(pObj0, fCompl0);
        pCover1 = pObj1->fMarkA? p->pManMin->pTriv1[fCompl1] : Abc_ObjGetCover(pObj1, fCompl1);
        // derive the new cover
        if ( pCover0 && pCover1 )
            pCoverP = Abc_NodeCovProduct( p, pCover0, pCover1, 0, vSupp->nSize );

        // get the covers for the inverse polarity
        pCover0 = pObj0->fMarkA? p->pManMin->pTriv0[!fCompl0] : Abc_ObjGetCover(pObj0, !fCompl0);
        pCover1 = pObj1->fMarkA? p->pManMin->pTriv1[!fCompl1] : Abc_ObjGetCover(pObj1, !fCompl1);
        // derive the new cover
        if ( pCover0 && pCover1 )
            pCoverN = Abc_NodeCovSum( p, pCover0, pCover1, 0, vSupp->nSize );
    }

    // if none of the covers can be computed quit
    if ( !pCoverX && !pCoverP && !pCoverN )
    {
        Vec_IntFree( vSupp );
        return 0;
    }

    // set the covers
    assert( Abc_ObjGetSupp(pObj) == NULL );
    Abc_ObjSetSupp( pObj, vSupp );
    Abc_ObjSetCover( pObj, pCoverP, 0 );
    Abc_ObjSetCover( pObj, pCoverN, 1 );
    Abc_ObjSetCover2( pObj, pCoverX );
//printf( "%3d : %4d  %4d  %4d\n", pObj->Id, Min_CoverCountCubes(pCoverP), Min_CoverCountCubes(pCoverN), Min_CoverCountCubes(pCoverX) );

    // count statistics
    p->nSupps++;
    p->nSuppsMax = Abc_MaxInt( p->nSuppsMax, p->nSupps );
    return 1;
}